

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O0

void cluster_points_recalculate(int n,int n_cluster,vec3f *positions,int *clusterids)

{
  float fVar1;
  undefined8 uVar2;
  long lVar3;
  allocator *paVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  vec3f *pvVar8;
  reference piVar9;
  size_type sVar10;
  ostream *poVar11;
  vec3f *pvVar12;
  int *piVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  vector<int,_std::allocator<int>_> *pvVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  vec3f vVar16;
  pointer piStack_4a0;
  vector<int,_std::allocator<int>_> vStack_498;
  vector<int,_std::allocator<int>_> *local_480;
  ostream *local_478;
  ostream *local_470;
  ostream *local_468;
  ostream *local_460;
  ostream *local_458;
  ostream *local_450;
  ostream *local_448;
  ostream *local_440;
  allocator *local_438;
  data_t local_42c;
  undefined1 local_428 [16];
  float local_418;
  float local_414;
  data_t local_410;
  data_t local_40c;
  undefined1 local_408 [16];
  data_t local_3f4;
  float local_3f0;
  data_t local_3ec;
  undefined1 local_3e8 [16];
  vector<int,_std::allocator<int>_> *local_3d0;
  vector<int,_std::allocator<int>_> *local_3c8;
  vector<int,_std::allocator<int>_> *local_3c0;
  ulong local_3b8;
  vector<int,_std::allocator<int>_> *local_3b0;
  int *local_3a8;
  vec3f *local_3a0;
  vec3f *local_398;
  vec3f *local_390;
  ulong local_388;
  vec3f *local_380;
  allocator *local_378;
  int local_370;
  int local_36c;
  int i_6;
  int i_5;
  ofstream fout;
  allocator local_161;
  string local_160 [36];
  int local_13c;
  iterator iStack_138;
  int x_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int i_4;
  iterator iStack_f8;
  int x;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vec3f sum;
  int i_3;
  vec3f local_c0;
  vec3f local_b0;
  vec3f local_a0;
  int local_90;
  int local_8c;
  int j;
  int best;
  float bestnorm;
  int i_2;
  int i_1;
  int k;
  unsigned_long __vla_expr1;
  ulong uStack_68;
  int i;
  unsigned_long __vla_expr0;
  allocator local_41;
  string local_40 [32];
  int *local_20;
  int *clusterids_local;
  vec3f *positions_local;
  int n_cluster_local;
  int n_local;
  
  local_378 = &local_41;
  piStack_4a0 = (pointer)0x18c3b9;
  local_20 = clusterids;
  clusterids_local = (int *)positions;
  positions_local._0_4_ = n_cluster;
  positions_local._4_4_ = n;
  std::allocator<char>::allocator();
  piStack_4a0 = (pointer)0x18c3d0;
  std::__cxx11::string::string(local_40,"receiver cluster",local_378);
  piStack_4a0 = (pointer)0x18c3e2;
  github111116::ConsoleLogger::time(&console,(time_t *)local_40);
  piStack_4a0 = (pointer)0x18c3ed;
  std::__cxx11::string::~string(local_40);
  piStack_4a0 = (pointer)0x18c3f6;
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_388 = (ulong)(uint)positions_local;
  lVar3 = -(local_388 * 0xc + 0xf & 0xfffffffffffffff0);
  pvVar12 = (vec3f *)((long)&vStack_498 + lVar3);
  local_380 = pvVar12;
  uStack_68 = local_388;
  __vla_expr0 = (unsigned_long)&vStack_498;
  if (local_388 != 0) {
    local_398 = pvVar12 + local_388;
    local_390 = pvVar12;
    __vla_expr0 = (unsigned_long)&vStack_498;
    do {
      pvVar8 = local_390;
      local_3a0 = local_390;
      *(undefined8 *)((long)&piStack_4a0 + lVar3) = 0x18c46a;
      vec3f::vec3f(pvVar8);
      local_390 = local_3a0 + 1;
    } while (local_390 != local_398);
  }
  for (__vla_expr1._4_4_ = 0; __vla_expr1._4_4_ < (int)(uint)positions_local;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    local_3a8 = clusterids_local;
    *(undefined8 *)((long)&piStack_4a0 + lVar3) = 0x18c4a7;
    iVar7 = rand();
    piVar13 = local_3a8 + (long)(iVar7 % positions_local._4_4_) * 3;
    pvVar8 = local_380 + __vla_expr1._4_4_;
    iVar7 = piVar13[1];
    pvVar8->x = (data_t)piVar13[0];
    pvVar8->y = (data_t)iVar7;
    pvVar8->z = (data_t)piVar13[2];
  }
  local_3b8 = (ulong)(uint)positions_local;
  pvVar14 = (vector<int,_std::allocator<int>_> *)
            ((long)pvVar12 - (local_3b8 * 0x18 + 0xf & 0xfffffffffffffff0));
  local_3b0 = pvVar14;
  _i_1 = local_3b8;
  if (local_3b8 != 0) {
    local_3c8 = pvVar14 + local_3b8;
    local_3c0 = pvVar14;
    do {
      pvVar15 = local_3c0;
      local_3d0 = local_3c0;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c583;
      std::vector<int,_std::allocator<int>_>::vector(pvVar15);
      local_3c0 = local_3d0 + 1;
    } while (local_3c0 != local_3c8);
  }
  for (i_2 = 0; i_2 < 10; i_2 = i_2 + 1) {
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18c5c9;
    github111116::ConsoleLogger::log<char[27],int>
              (&console,(char (*) [27])"receiver cluster iteration",&i_2);
    for (bestnorm = 0.0; (int)bestnorm < (int)(uint)positions_local;
        bestnorm = (float)((int)bestnorm + 1)) {
      pvVar15 = local_3b0 + (int)bestnorm;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c5f1;
      std::vector<int,_std::allocator<int>_>::clear(pvVar15);
    }
    for (best = 0; best < positions_local._4_4_; best = best + 1) {
      j = 0x5d5e0b6b;
      local_8c = 0;
      for (local_90 = 0; local_90 < (int)(uint)positions_local; local_90 = local_90 + 1) {
        local_3f0 = (float)j;
        pvVar12 = (vec3f *)(clusterids_local + (long)best * 3);
        pvVar8 = local_380 + local_90;
        pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x18c688;
        vVar16 = operator-(pvVar12,pvVar8);
        local_3ec = vVar16.z;
        local_b0._0_8_ = vVar16._0_8_;
        local_3e8._8_4_ = extraout_XMM0_Dc;
        local_3e8._0_4_ = local_b0.x;
        local_3e8._4_4_ = local_b0.y;
        local_3e8._12_4_ = extraout_XMM0_Dd;
        local_b0.z = local_3ec;
        local_a0._0_8_ = local_b0._0_8_;
        local_a0.z = local_3ec;
        pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x18c6de;
        local_3f4 = norm(&local_a0);
        if (local_3f4 < local_3f0) {
          pvVar12 = (vec3f *)(clusterids_local + (long)best * 3);
          pvVar8 = local_380 + local_90;
          pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x18c72c;
          vVar16 = operator-(pvVar12,pvVar8);
          local_40c = vVar16.z;
          unique0x100001f6 = vVar16._0_8_;
          local_408._8_4_ = extraout_XMM0_Dc_00;
          local_408._0_4_ = (data_t)unique0x100001f6;
          local_408._4_4_ = SUB84(unique0x100001f6,4);
          local_408._12_4_ = extraout_XMM0_Dd_00;
          local_c0._0_8_ = unique0x100001f6;
          local_c0.z = local_40c;
          pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x18c782;
          local_410 = norm(&local_c0);
          local_8c = local_90;
          j = (int)local_410;
        }
      }
      pvVar15 = local_3b0 + local_8c;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c7da;
      std::vector<int,_std::allocator<int>_>::push_back(pvVar15,&best);
    }
    for (sum.y = 0.0; (int)sum.y < (int)(uint)positions_local; sum.y = (data_t)((int)sum.y + 1)) {
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c814;
      vec3f::vec3f((vec3f *)&__range3,0.0);
      pvVar15 = local_3b0 + (int)sum.y;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c83e;
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar15);
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c851;
      iStack_f8 = std::vector<int,_std::allocator<int>_>::end(pvVar15);
      while( true ) {
        pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x18c86b;
        bVar6 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff08);
        if (!bVar6) break;
        pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x18c87d;
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        pvVar12 = (vec3f *)(clusterids_local + (long)*piVar9 * 3);
        pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x18c8a4;
        operator+=((vec3f *)&__range3,pvVar12);
        pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x18c8b4;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      pvVar15 = local_3b0 + (int)sum.y;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c8d1;
      sVar10 = std::vector<int,_std::allocator<int>_>::size(pvVar15);
      local_418 = (float)(long)sVar10;
      local_414 = (float)sVar10;
      fVar1 = local_414;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18c926;
      vVar16 = operator/((vec3f *)&__range3,fVar1);
      local_42c = vVar16.z;
      uVar2 = vVar16._0_8_;
      local_428._8_4_ = extraout_XMM0_Dc_01;
      local_428._0_8_ = uVar2;
      local_428._12_4_ = extraout_XMM0_Dd_01;
      pvVar12 = local_380 + (int)sum.y;
      pvVar12->x = (data_t)(int)uVar2;
      pvVar12->y = (data_t)(int)((ulong)uVar2 >> 0x20);
      pvVar12->z = local_42c;
    }
  }
  for (__range2._4_4_ = 0; __range2._4_4_ < (int)(uint)positions_local;
      __range2._4_4_ = __range2._4_4_ + 1) {
    pvVar15 = local_3b0 + __range2._4_4_;
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18c9fd;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar15);
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18ca10;
    iStack_138 = std::vector<int,_std::allocator<int>_>::end(pvVar15);
    while( true ) {
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18ca2a;
      bVar6 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffec8);
      if (!bVar6) break;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18ca3c;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_13c = *piVar9;
      local_20[local_13c] = __range2._4_4_;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18ca64;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  local_438 = &local_161;
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18ca8f;
  std::allocator<char>::allocator();
  paVar4 = local_438;
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18caa9;
  std::__cxx11::string::string(local_160,"receiver cluster",paVar4);
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cabe;
  github111116::ConsoleLogger::timeEnd(&console,(string *)local_160);
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cacc;
  std::__cxx11::string::~string(local_160);
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cad8;
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18caeb;
  github111116::ConsoleLogger::log<char[27]>(&console,(char (*) [27])"cluster caching to disk...");
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cb05;
  std::ofstream::ofstream(&i_6,"cluster.cache",_S_out);
  iVar7 = positions_local._4_4_;
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cb16;
  poVar11 = (ostream *)std::ostream::operator<<(&i_6,iVar7);
  local_440 = poVar11;
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cb32;
  std::operator<<(poVar11,"\n");
  uVar5 = (uint)positions_local;
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cb43;
  poVar11 = (ostream *)std::ostream::operator<<(&i_6,uVar5);
  local_448 = poVar11;
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cb5f;
  std::operator<<(poVar11,"\n");
  for (local_36c = 0; local_36c < positions_local._4_4_; local_36c = local_36c + 1) {
    fVar1 = (float)clusterids_local[(long)local_36c * 3];
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18cb9a;
    poVar11 = (ostream *)std::ostream::operator<<(&i_6,fVar1);
    local_450 = poVar11;
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18cbb6;
    poVar11 = std::operator<<(poVar11," ");
    fVar1 = (float)clusterids_local[(long)local_36c * 3 + 1];
    local_458 = poVar11;
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18cbe0;
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,fVar1);
    local_460 = poVar11;
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18cbfc;
    poVar11 = std::operator<<(poVar11," ");
    fVar1 = (float)clusterids_local[(long)local_36c * 3 + 2];
    local_468 = poVar11;
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18cc26;
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,fVar1);
    local_470 = poVar11;
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18cc42;
    std::operator<<(poVar11,"\n");
  }
  for (local_370 = 0; local_370 < positions_local._4_4_; local_370 = local_370 + 1) {
    iVar7 = local_20[local_370];
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18ccdd;
    poVar11 = (ostream *)std::ostream::operator<<(&i_6,iVar7);
    local_478 = poVar11;
    pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x18ccf9;
    std::operator<<(poVar11,"\n");
  }
  pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x18cd1a;
  std::ofstream::~ofstream(&i_6);
  local_480 = local_3b0 + local_3b8;
  if (local_3b0 != local_480) {
    do {
      pvVar15 = local_480 + -1;
      vStack_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)pvVar15;
      pvVar14[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x18cd55;
      std::vector<int,_std::allocator<int>_>::~vector(pvVar15);
      local_480 = (vector<int,_std::allocator<int>_> *)
                  vStack_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    } while ((vector<int,_std::allocator<int>_> *)
             vStack_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != local_3b0);
  }
  return;
}

Assistant:

void cluster_points_recalculate(int n, int n_cluster, const vec3f* positions, int* clusterids)
{
	console.time("receiver cluster");
	// random initialize clusters
	vec3f center[n_cluster];
	for (int i=0; i<n_cluster; ++i)
		center[i] = positions[rand()%n]; // a few may coincide, doesn't matter

	std::vector<int> assigned[n_cluster];
	for (int k=0; k<10; ++k) {
		console.log("receiver cluster iteration",k);
		for (int i=0; i<n_cluster; ++i)
			assigned[i].clear();
		// assign points to nearest cluster
		for (int i=0; i<n; ++i) {
			float bestnorm = 1e18;
			int best = 0;
			for (int j=0; j<n_cluster; ++j)
				if (bestnorm > norm(positions[i] - center[j])) {
					bestnorm = norm(positions[i] - center[j]);
					best = j;
				}
			assigned[best].push_back(i);
		}
		// move cluster center to average of points
		for (int i=0; i<n_cluster; ++i) {
			vec3f sum = 0;
			for (int x: assigned[i])
				sum += positions[x];
			center[i] = sum / assigned[i].size();
		}
	}
	for (int i=0; i<n_cluster; ++i)
		for (int x: assigned[i])
			clusterids[x] = i;
	console.timeEnd("receiver cluster");
	console.log("cluster caching to disk...");
	std::ofstream fout(cluster_file);
	fout << n << "\n";
	fout << n_cluster << "\n";
	for (int i=0; i<n; ++i)
		fout << positions[i].x << " " << positions[i].y << " " << positions[i].z << "\n";
	for (int i=0; i<n; ++i)
		fout << clusterids[i] << "\n";
}